

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O0

Result __thiscall
GetOpt::_OptionTBase<int>::operator()
          (_OptionTBase<int> *this,ShortOptions *short_ops,LongOptions *long_ops,Token *param_3,
          fmtflags flags)

{
  bool bVar1;
  pointer ppVar2;
  ulong uVar3;
  pointer ppVar4;
  _Self local_60;
  _Self local_58;
  iterator it_1;
  _Rb_tree_iterator<std::pair<const_char,_GetOpt::OptionData>_> local_38;
  iterator it;
  Result ret;
  fmtflags flags_local;
  Token *param_3_local;
  LongOptions *long_ops_local;
  ShortOptions *short_ops_local;
  _OptionTBase<int> *this_local;
  
  it._M_node._0_4_ = OptionNotFound;
  it._M_node._4_4_ = flags;
  std::_Rb_tree_iterator<std::pair<const_char,_GetOpt::OptionData>_>::_Rb_tree_iterator(&local_38);
  if (this->short_opt == '\0') {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
         ::end(short_ops);
  }
  else {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
         ::find(short_ops,&this->short_opt);
  }
  it_1._M_node = (_Base_ptr)
                 std::
                 map<char,_GetOpt::OptionData,_std::less<char>,_std::allocator<std::pair<const_char,_GetOpt::OptionData>_>_>
                 ::end(short_ops);
  bVar1 = std::operator!=(&local_38,(_Self *)&it_1);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_char,_GetOpt::OptionData>_>::operator->
                       (&local_38);
    (ppVar2->second).flags = CmdLine_Extracted;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_char,_GetOpt::OptionData>_>::operator->
                       (&local_38);
    it._M_node._0_4_ =
         (*(this->super__Option)._vptr__Option[3])
                   (this,(ppVar2->second).token,(ulong)(uint)it._M_node._4_4_,short_ops);
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_58._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
           ::find(long_ops,&this->long_opt);
      local_60._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
           ::end(long_ops);
      bVar1 = std::operator!=(&local_58,&local_60);
      if (bVar1) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>
                 ::operator->(&local_58);
        (ppVar4->second).flags = CmdLine_Extracted;
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>
                 ::operator->(&local_58);
        it._M_node._0_4_ =
             (*(this->super__Option)._vptr__Option[3])
                       (this,(ppVar4->second).token,(ulong)(uint)it._M_node._4_4_,short_ops);
      }
    }
  }
  return (Result)it._M_node;
}

Assistant:

virtual Result operator()(ShortOptions& short_ops, LongOptions& long_ops, Token* /*first*/, std::ios::fmtflags flags) const
    {
        Result ret = OptionNotFound;
        ShortOptions::iterator it;
        if (short_opt == _Option::NO_SHORT_OPT)
            it = short_ops.end();
        else
            it = short_ops.find(short_opt);

        if (it != short_ops.end())
        {
            it->second.flags = OptionData::CmdLine_Extracted;
            ret = _assign(it->second.token, flags, short_ops);
        }
        else if (!long_opt.empty())
        {
            LongOptions::iterator it = long_ops.find(long_opt);
            if (it != long_ops.end())
            {
                it->second.flags = OptionData::CmdLine_Extracted;
                ret = _assign(it->second.token, flags, short_ops);
            }
        }

        return ret;
    }